

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void __thiscall
cmCPluginAPISourceFileMap::~cmCPluginAPISourceFileMap(cmCPluginAPISourceFileMap *this)

{
  cmCPluginAPISourceFile *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  cmCPluginAPISourceFileMap *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
       ::begin(&this->
                super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              );
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
         ::end(&this->
                super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              );
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>::
             operator->(&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (cmCPluginAPISourceFile *)0x0) {
      cmCPluginAPISourceFile::~cmCPluginAPISourceFile(this_00);
      operator_delete(this_00,0xb0);
    }
    std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>::operator++
              (&local_18);
  }
  std::
  map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
  ::~map(&this->
          super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
        );
  return;
}

Assistant:

~cmCPluginAPISourceFileMap()
    {
    for(iterator i=this->begin(); i != this->end(); ++i)
      {
      delete i->second;
      }
    }